

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> __thiscall
libtorrent::torrent_handle::
sync_call_ret<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&>
          (torrent_handle *this,
          strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> def,
          offset_in_torrent_to_subr f,strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a)

{
  bool bVar1;
  element_type *this_00;
  session_impl *this_01;
  io_context *ctx;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  undefined1 local_c8 [8];
  undefined1 local_c0 [64];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_80;
  exception_ptr local_78;
  exception_ptr ex;
  bool done;
  session_impl *ses;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a_local;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_9 [7];
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> def_local;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> r;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_R8;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_50);
  local_9[0].m_val = def.m_val;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    throw_invalid_handle();
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
  this_01 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ex._M_exception_object._7_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78);
  ctx = libtorrent::aux::session_impl::get_context(this_01);
  local_c0._0_8_ = local_9;
  local_c0._8_8_ = (long)&ex._M_exception_object + 7;
  local_c0._16_8_ = this_01;
  local_c0._24_8_ = &local_78;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_c0 + 0x20),
             (shared_ptr<libtorrent::aux::torrent> *)local_50);
  local_80.m_val =
       *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base;
  local_c0._48_8_ = f;
  local_c0._56_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&>(libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&)const::_lambda()_1_>
            (ctx,(type_conflict4 *)local_c0,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)local_c0);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 7),this_01);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_50);
    return (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>)local_9[0].m_val;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_c8,&local_78);
  uVar2 = ::std::rethrow_exception((exception_ptr)local_c8);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)local_c0);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_50);
  _Unwind_Resume(uVar2);
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}